

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O1

JSValue js_object_getOwnPropertyDescriptor
                  (JSContext *ctx,JSValue this_val,int argc,JSValue *argv,int magic)

{
  JSValue val;
  JSValue val_00;
  JSAtom prop;
  int iVar1;
  JSAtom prop_00;
  undefined4 in_register_0000000c;
  ulong uVar2;
  ulong uVar3;
  uint uVar4;
  int64_t iVar5;
  JSValue v;
  JSValue JVar6;
  JSValue val_01;
  JSValue val_02;
  JSValue val_03;
  JSPropertyDescriptor desc;
  JSValueUnion local_70;
  JSValueUnion local_68;
  JSValueUnion local_60;
  int64_t local_58;
  JSValueUnion local_50;
  int64_t local_48;
  JSValueUnion local_40;
  int64_t local_38;
  
  if (magic == 0) {
    v = JS_ToObject(ctx,*argv);
    if ((int)v.tag == 6) {
      return v;
    }
  }
  else {
    if ((int)argv->tag != -1) {
      JS_ThrowTypeError(ctx,"not an object",this_val.tag,CONCAT44(in_register_0000000c,argc));
      return (JSValue)(ZEXT816(6) << 0x40);
    }
    local_68 = (JSValueUnion)(argv->u).ptr;
    v.tag = argv->tag;
    v.u.ptr = local_68.ptr;
    *(int *)local_68.ptr = *local_68.ptr + 1;
  }
  local_70 = v.u;
  prop = JS_ValueToAtom(ctx,argv[1]);
  uVar4 = (uint)v.tag;
  if (prop == 0) goto LAB_001630ad;
  iVar5 = 3;
  if (uVar4 == 0xffffffff) {
    iVar1 = JS_GetOwnPropertyInternal
                      (ctx,(JSPropertyDescriptor *)&local_68,(JSObject *)local_70.ptr,prop);
    if (iVar1 < 0) goto LAB_001630ad;
    if (iVar1 != 0) {
      JVar6 = JS_NewObjectProtoClass(ctx,ctx->class_proto[1],1);
      iVar5 = JVar6.tag;
      JVar6.u = JVar6.u;
      if ((uint)JVar6.tag != 6) {
        if (((ulong)local_68.ptr & 0x10) == 0) {
          val.tag = local_58;
          val.u.ptr = local_60.ptr;
          if (0xfffffff4 < (uint)local_58) {
            *(int *)local_60.ptr = *local_60.ptr + 1;
          }
          iVar1 = JS_DefinePropertyValue(ctx,JVar6,0x40,val,0x4007);
          if (-1 < iVar1) {
            local_40._0_4_ = (uint)local_68.int32 >> 1 & 1;
            local_40._4_4_ = 0;
            local_38 = 1;
            prop_00 = 0x3e;
LAB_0016324b:
            val_01.tag = local_38;
            val_01.u.float64 = local_40.float64;
            iVar1 = JS_DefinePropertyValue(ctx,JVar6,prop_00,val_01,0x4007);
            if (-1 < iVar1) {
              val_02.u._0_4_ = (uint)local_68.int32 >> 2 & 1;
              val_02.u._4_4_ = 0;
              val_02.tag = 1;
              iVar1 = JS_DefinePropertyValue(ctx,JVar6,0x3f,val_02,0x4007);
              if (-1 < iVar1) {
                val_03.u._0_4_ = local_68.int32 & 1;
                val_03.u._4_4_ = 0;
                val_03.tag = 1;
                iVar1 = JS_DefinePropertyValue(ctx,JVar6,0x3d,val_03,0x4007);
                if (-1 < iVar1) {
                  uVar3 = (ulong)JVar6.u.ptr & 0xffffffff00000000;
                  js_free_desc(ctx,(JSPropertyDescriptor *)&local_68);
                  uVar2 = (ulong)JVar6.u.ptr & 0xffffffff;
                  goto LAB_00163118;
                }
              }
            }
          }
        }
        else {
          val_00.tag = local_48;
          val_00.u.ptr = local_50.ptr;
          if (0xfffffff4 < (uint)local_48) {
            *(int *)local_50.ptr = *local_50.ptr + 1;
          }
          iVar1 = JS_DefinePropertyValue(ctx,JVar6,0x41,val_00,0x4007);
          if (-1 < iVar1) {
            if (0xfffffff4 < (uint)local_38) {
              *(int *)local_40.ptr = *local_40.ptr + 1;
            }
            prop_00 = 0x42;
            goto LAB_0016324b;
          }
        }
      }
      js_free_desc(ctx,(JSPropertyDescriptor *)&local_68);
      if ((0xfffffff4 < (uint)JVar6.tag) &&
         (iVar1 = *JVar6.u.ptr, *(int *)JVar6.u.ptr = iVar1 + -1, iVar1 < 2)) {
        __JS_FreeValueRT(ctx->rt,JVar6);
      }
LAB_001630ad:
      JS_FreeAtom(ctx,prop);
      if ((0xfffffff4 < uVar4) &&
         (iVar1 = *local_70.ptr, *(int *)local_70.ptr = iVar1 + -1, iVar1 < 2)) {
        __JS_FreeValueRT(ctx->rt,v);
      }
      return (JSValue)(ZEXT816(6) << 0x40);
    }
  }
  uVar2 = 0;
  uVar3 = 0;
LAB_00163118:
  JS_FreeAtom(ctx,prop);
  if ((0xfffffff4 < uVar4) && (iVar1 = *local_70.ptr, *(int *)local_70.ptr = iVar1 + -1, iVar1 < 2))
  {
    __JS_FreeValueRT(ctx->rt,v);
  }
  JVar6.tag = iVar5;
  JVar6.u.ptr = (void *)(uVar3 | uVar2);
  return JVar6;
}

Assistant:

static JSValue js_object_getOwnPropertyDescriptor(JSContext *ctx, JSValueConst this_val,
                                                  int argc, JSValueConst *argv, int magic)
{
    JSValueConst prop;
    JSAtom atom;
    JSValue ret, obj;
    JSPropertyDescriptor desc;
    int res, flags;

    if (magic) {
        /* Reflect.getOwnPropertyDescriptor case */
        if (JS_VALUE_GET_TAG(argv[0]) != JS_TAG_OBJECT)
            return JS_ThrowTypeErrorNotAnObject(ctx);
        obj = JS_DupValue(ctx, argv[0]);
    } else {
        obj = JS_ToObject(ctx, argv[0]);
        if (JS_IsException(obj))
            return obj;
    }
    prop = argv[1];
    atom = JS_ValueToAtom(ctx, prop);
    if (unlikely(atom == JS_ATOM_NULL))
        goto exception;
    ret = JS_UNDEFINED;
    if (JS_VALUE_GET_TAG(obj) == JS_TAG_OBJECT) {
        res = JS_GetOwnPropertyInternal(ctx, &desc, JS_VALUE_GET_OBJ(obj), atom);
        if (res < 0)
            goto exception;
        if (res) {
            ret = JS_NewObject(ctx);
            if (JS_IsException(ret))
                goto exception1;
            flags = JS_PROP_C_W_E | JS_PROP_THROW;
            if (desc.flags & JS_PROP_GETSET) {
                if (JS_DefinePropertyValue(ctx, ret, JS_ATOM_get, JS_DupValue(ctx, desc.getter), flags) < 0
                ||  JS_DefinePropertyValue(ctx, ret, JS_ATOM_set, JS_DupValue(ctx, desc.setter), flags) < 0)
                    goto exception1;
            } else {
                if (JS_DefinePropertyValue(ctx, ret, JS_ATOM_value, JS_DupValue(ctx, desc.value), flags) < 0
                ||  JS_DefinePropertyValue(ctx, ret, JS_ATOM_writable,
                                           JS_NewBool(ctx, (desc.flags & JS_PROP_WRITABLE) != 0), flags) < 0)
                    goto exception1;
            }
            if (JS_DefinePropertyValue(ctx, ret, JS_ATOM_enumerable,
                                       JS_NewBool(ctx, (desc.flags & JS_PROP_ENUMERABLE) != 0), flags) < 0
            ||  JS_DefinePropertyValue(ctx, ret, JS_ATOM_configurable,
                                       JS_NewBool(ctx, (desc.flags & JS_PROP_CONFIGURABLE) != 0), flags) < 0)
                goto exception1;
            js_free_desc(ctx, &desc);
        }
    }
    JS_FreeAtom(ctx, atom);
    JS_FreeValue(ctx, obj);
    return ret;

exception1:
    js_free_desc(ctx, &desc);
    JS_FreeValue(ctx, ret);
exception:
    JS_FreeAtom(ctx, atom);
    JS_FreeValue(ctx, obj);
    return JS_EXCEPTION;
}